

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O2

int __thiscall
ncnn::ConvolutionDepthWise_x86::forward
          (ConvolutionDepthWise_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int iVar10;
  size_t _elemsize;
  long lVar11;
  Layer *pLVar12;
  uint uVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  int iVar22;
  long lVar23;
  void *pvVar24;
  long lVar25;
  void *pvVar26;
  uint uVar27;
  uint uVar28;
  int iVar29;
  ulong uVar30;
  long lVar31;
  long lVar32;
  void *pvVar33;
  _func_int *p_Var34;
  int iVar35;
  void *pvVar36;
  int remain_1;
  long lVar37;
  int remain;
  int iVar38;
  void *pvVar39;
  float *pfVar40;
  long lVar41;
  void *pvVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  int local_184;
  int local_180;
  Mat bottom_blob_bordered;
  Mat top_blob_g;
  Mat out;
  Option opt_g;
  
  p_Var34 = this->_vptr_ConvolutionDepthWise_x86[-3];
  if ((opt->use_int8_inference == true) && (*(long *)(&this->field_0x150 + (long)p_Var34) == 1)) {
    iVar22 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar22;
  }
  iVar22 = bottom_blob->c;
  _elemsize = bottom_blob->elemsize;
  iVar35 = *(int *)(&this->field_0xbc + (long)p_Var34);
  iVar38 = *(int *)(&this->field_0xc0 + (long)p_Var34);
  iVar29 = *(int *)(&this->field_0xc4 + (long)p_Var34);
  iVar10 = *(int *)(&this->field_0xc8 + (long)p_Var34);
  bottom_blob_bordered.elemsize._0_4_ = 0;
  bottom_blob_bordered.elemsize._4_4_ = 0;
  bottom_blob_bordered.elempack = 0;
  bottom_blob_bordered.data = (void *)0x0;
  bottom_blob_bordered.refcount._0_4_ = 0;
  bottom_blob_bordered.refcount._4_4_ = 0;
  bottom_blob_bordered.allocator = (Allocator *)0x0;
  bottom_blob_bordered.dims = 0;
  bottom_blob_bordered.w = 0;
  bottom_blob_bordered.h = 0;
  bottom_blob_bordered.c = 0;
  bottom_blob_bordered.cstep = 0;
  ConvolutionDepthWise::make_padding
            ((ConvolutionDepthWise *)((long)&this->_vptr_ConvolutionDepthWise_x86 + (long)p_Var34),
             bottom_blob,&bottom_blob_bordered,opt);
  local_180 = -100;
  if ((bottom_blob_bordered.data == (void *)0x0) ||
     ((long)bottom_blob_bordered.c * bottom_blob_bordered.cstep == 0)) goto LAB_00149fee;
  p_Var34 = this->_vptr_ConvolutionDepthWise_x86[-3];
  Mat::create(top_blob,(~((iVar35 + -1) * iVar29) + bottom_blob_bordered.w) /
                       *(int *)(&this->field_0xcc + (long)p_Var34) + 1,
              (~((iVar38 + -1) * iVar10) + bottom_blob_bordered.h) /
              *(int *)(&this->field_0xd0 + (long)p_Var34) + 1,
              *(int *)(&this->field_0xb8 + (long)p_Var34),_elemsize,opt->blob_allocator);
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_00149fee;
  p_Var34 = this->_vptr_ConvolutionDepthWise_x86[-3];
  iVar35 = *(int *)(&this->field_0xf0 + (long)p_Var34);
  iVar38 = *(int *)(&this->field_0xb8 + (long)p_Var34);
  if (((*(int *)(&this->field_0xb8 + (long)p_Var34) == iVar22 && iVar22 == iVar35) &&
      (iVar38 = iVar22, *(int *)(&this->field_0xbc + (long)p_Var34) == 3)) &&
     (*(int *)(&this->field_0xc0 + (long)p_Var34) == 3)) {
    if ((((*(int *)(&this->field_0xc4 + (long)p_Var34) == 1) &&
         (*(int *)(&this->field_0xc8 + (long)p_Var34) == 1)) &&
        (*(int *)(&this->field_0xcc + (long)p_Var34) == 1)) &&
       (*(int *)(&this->field_0xd0 + (long)p_Var34) == 1)) {
      lVar23 = (long)bottom_blob_bordered.w;
      iVar22 = top_blob->w;
      iVar35 = top_blob->h;
      lVar41 = *(long *)(&this->field_0x140 + (long)p_Var34);
      lVar11 = *(long *)(&this->field_0x180 + (long)p_Var34);
      lVar25 = (long)iVar22;
      uVar30 = 0;
      uVar13 = bottom_blob_bordered.c;
      if (bottom_blob_bordered.c < 1) {
        uVar13 = 0;
      }
      lVar31 = (long)(bottom_blob_bordered.w + 2) * 4;
      for (; uVar30 != uVar13; uVar30 = uVar30 + 1) {
        Mat::channel(&out,top_blob,(int)uVar30);
        pvVar33 = out.data;
        if (lVar11 == 0) {
          fVar3 = 0.0;
        }
        else {
          fVar3 = *(float *)(lVar11 + uVar30 * 4);
        }
        lVar32 = uVar30 * 0x24;
        top_blob_g.elemsize =
             CONCAT44(bottom_blob_bordered.elemsize._4_4_,(undefined4)bottom_blob_bordered.elemsize)
        ;
        pvVar39 = (void *)((long)(int)uVar30 * bottom_blob_bordered.cstep * top_blob_g.elemsize +
                          (long)bottom_blob_bordered.data);
        top_blob_g.refcount = (int *)0x0;
        top_blob_g.elempack = bottom_blob_bordered.elempack;
        top_blob_g.allocator = bottom_blob_bordered.allocator;
        top_blob_g.dims = 2;
        top_blob_g.w = bottom_blob_bordered.w;
        top_blob_g.h = bottom_blob_bordered.h;
        top_blob_g.c = 1;
        top_blob_g.cstep = (size_t)(bottom_blob_bordered.h * bottom_blob_bordered.w);
        top_blob_g.data = pvVar39;
        Mat::~Mat(&top_blob_g);
        pvVar24 = (void *)((long)pvVar39 + lVar23 * 4);
        pvVar26 = (void *)((long)pvVar39 + lVar23 * 8);
        pvVar36 = (void *)((long)pvVar39 + lVar23 * 0xc);
        pvVar42 = pvVar33;
        for (uVar27 = 0; (int)(uVar27 | 1) < iVar35; uVar27 = uVar27 + 2) {
          lVar37 = 0;
          for (iVar38 = iVar22; 0 < iVar38; iVar38 = iVar38 + -1) {
            uVar8 = *(undefined8 *)((long)pvVar39 + lVar37 + 4);
            uVar9 = *(undefined8 *)((long)pvVar24 + lVar37 + 4);
            pfVar40 = (float *)(lVar41 + lVar32);
            fVar14 = *pfVar40;
            fVar15 = pfVar40[1];
            fVar16 = pfVar40[2];
            fVar17 = pfVar40[3];
            pfVar40 = (float *)(lVar41 + 0x10 + lVar32);
            fVar18 = *pfVar40;
            fVar19 = pfVar40[1];
            fVar20 = pfVar40[2];
            fVar21 = pfVar40[3];
            fVar4 = *(float *)((long)pvVar24 + lVar37);
            fVar43 = (float)uVar9;
            fVar44 = (float)((ulong)uVar9 >> 0x20);
            fVar45 = (float)*(undefined8 *)((long)pvVar26 + lVar37);
            fVar46 = (float)((ulong)*(undefined8 *)((long)pvVar26 + lVar37) >> 0x20);
            fVar5 = *(float *)((long)pvVar26 + lVar37 + 8);
            fVar6 = *(float *)(lVar41 + 0x20 + lVar32);
            uVar9 = *(undefined8 *)((long)pvVar36 + lVar37);
            fVar7 = *(float *)((long)pvVar36 + lVar37 + 8);
            *(float *)((long)pvVar33 + lVar37) =
                 fVar6 * fVar5 + fVar3 +
                 fVar46 * fVar21 + fVar4 * fVar17 + fVar44 * fVar19 + (float)uVar8 * fVar15 +
                 fVar45 * fVar20 + (float)((ulong)uVar8 >> 0x20) * fVar16 +
                 fVar43 * fVar18 + *(float *)((long)pvVar39 + lVar37) * fVar14;
            *(float *)((long)pvVar42 + lVar37 + lVar25 * 4) =
                 fVar6 * fVar7 + fVar3 +
                 (float)((ulong)uVar9 >> 0x20) * fVar21 + fVar17 * fVar45 +
                 fVar5 * fVar19 + fVar15 * fVar43 +
                 (float)uVar9 * fVar20 + fVar16 * fVar44 + fVar46 * fVar18 + fVar4 * fVar14;
            lVar37 = lVar37 + 4;
          }
          pvVar39 = (void *)((long)pvVar39 + lVar37 + lVar31);
          pvVar24 = (void *)((long)pvVar24 + lVar37 + lVar31);
          pvVar26 = (void *)((long)pvVar26 + lVar37 + lVar31);
          pvVar36 = (void *)((long)pvVar36 + lVar37 + lVar31);
          pvVar33 = (void *)((long)pvVar33 + lVar37 + lVar25 * 4);
          pvVar42 = (void *)((long)pvVar42 + lVar37 + lVar25 * 4);
        }
        for (; (int)uVar27 < iVar35; uVar27 = uVar27 + 1) {
          lVar37 = 0;
          for (iVar38 = iVar22; 0 < iVar38; iVar38 = iVar38 + -1) {
            uVar8 = *(undefined8 *)((long)pvVar39 + lVar37 + 4);
            pfVar2 = (float *)(lVar41 + lVar32);
            pfVar40 = (float *)(lVar41 + 0x10 + lVar32);
            uVar9 = *(undefined8 *)((long)pvVar24 + lVar37 + 4);
            *(float *)((long)pvVar33 + lVar37) =
                 *(float *)(lVar41 + 0x20 + lVar32) * *(float *)((long)pvVar26 + lVar37 + 8) + fVar3
                 + (float)((ulong)*(undefined8 *)((long)pvVar26 + lVar37) >> 0x20) * pfVar40[3] +
                   *(float *)((long)pvVar24 + lVar37) * pfVar2[3] +
                   (float)((ulong)uVar9 >> 0x20) * pfVar40[1] + (float)uVar8 * pfVar2[1] +
                   (float)*(undefined8 *)((long)pvVar26 + lVar37) * pfVar40[2] +
                   (float)((ulong)uVar8 >> 0x20) * pfVar2[2] +
                   (float)uVar9 * *pfVar40 + *(float *)((long)pvVar39 + lVar37) * *pfVar2;
            lVar37 = lVar37 + 4;
          }
          pvVar39 = (void *)((long)pvVar39 + lVar37 + 8);
          pvVar24 = (void *)((long)pvVar24 + lVar37 + 8);
          pvVar26 = (void *)((long)pvVar26 + lVar37 + 8);
          pvVar33 = (void *)((long)pvVar33 + lVar37);
        }
        Mat::~Mat(&out);
      }
    }
    else {
      if (((*(int *)(&this->field_0xc4 + (long)p_Var34) != 1) ||
          (*(int *)(&this->field_0xc8 + (long)p_Var34) != 1)) ||
         ((*(int *)(&this->field_0xcc + (long)p_Var34) != 2 ||
          (*(int *)(&this->field_0xd0 + (long)p_Var34) != 2)))) goto LAB_00149ecd;
      lVar23 = (long)bottom_blob_bordered.w;
      iVar22 = top_blob->w;
      lVar41 = *(long *)(&this->field_0x140 + (long)p_Var34);
      lVar11 = *(long *)(&this->field_0x180 + (long)p_Var34);
      uVar30 = 0;
      uVar13 = top_blob->h;
      if (top_blob->h < 1) {
        uVar13 = 0;
      }
      uVar27 = bottom_blob_bordered.c;
      if (bottom_blob_bordered.c < 1) {
        uVar27 = 0;
      }
      lVar25 = (long)((bottom_blob_bordered.w - iVar22) * 2) * 4;
      for (; uVar30 != uVar27; uVar30 = uVar30 + 1) {
        Mat::channel(&out,top_blob,(int)uVar30);
        pfVar40 = (float *)out.data;
        if (lVar11 == 0) {
          fVar3 = 0.0;
        }
        else {
          fVar3 = *(float *)(lVar11 + uVar30 * 4);
        }
        lVar31 = uVar30 * 0x24;
        top_blob_g.elemsize =
             CONCAT44(bottom_blob_bordered.elemsize._4_4_,(undefined4)bottom_blob_bordered.elemsize)
        ;
        pvVar26 = (void *)((long)(int)uVar30 * bottom_blob_bordered.cstep * top_blob_g.elemsize +
                          (long)bottom_blob_bordered.data);
        top_blob_g.refcount = (int *)0x0;
        top_blob_g.elempack = bottom_blob_bordered.elempack;
        top_blob_g.allocator = bottom_blob_bordered.allocator;
        top_blob_g.dims = 2;
        top_blob_g.w = bottom_blob_bordered.w;
        top_blob_g.h = bottom_blob_bordered.h;
        top_blob_g.c = 1;
        top_blob_g.cstep = (size_t)(bottom_blob_bordered.h * bottom_blob_bordered.w);
        top_blob_g.data = pvVar26;
        Mat::~Mat(&top_blob_g);
        pvVar33 = (void *)((long)pvVar26 + lVar23 * 4);
        pvVar24 = (void *)((long)pvVar26 + lVar23 * 8);
        for (uVar28 = 0; uVar28 != uVar13; uVar28 = uVar28 + 1) {
          lVar32 = 0;
          for (iVar35 = iVar22; 0 < iVar35; iVar35 = iVar35 + -1) {
            uVar8 = *(undefined8 *)((long)pvVar26 + lVar32 + 4);
            pfVar2 = (float *)(lVar41 + lVar31);
            pfVar1 = (float *)(lVar41 + 0x10 + lVar31);
            uVar9 = *(undefined8 *)((long)pvVar33 + lVar32 + 4);
            *pfVar40 = (float)((ulong)*(undefined8 *)((long)pvVar24 + lVar32) >> 0x20) * pfVar1[3] +
                       *(float *)((long)pvVar33 + lVar32) * pfVar2[3] +
                       (float)((ulong)uVar9 >> 0x20) * pfVar1[1] + (float)uVar8 * pfVar2[1] +
                       (float)*(undefined8 *)((long)pvVar24 + lVar32) * pfVar1[2] +
                       (float)((ulong)uVar8 >> 0x20) * pfVar2[2] +
                       (float)uVar9 * *pfVar1 + *(float *)((long)pvVar26 + lVar32) * *pfVar2 +
                       *(float *)(lVar41 + 0x20 + lVar31) * *(float *)((long)pvVar24 + lVar32 + 8) +
                       fVar3;
            pfVar40 = pfVar40 + 1;
            lVar32 = lVar32 + 8;
          }
          pvVar26 = (void *)((long)pvVar26 + lVar32 + lVar25);
          pvVar33 = (void *)((long)pvVar33 + lVar32 + lVar25);
          pvVar24 = (void *)((long)pvVar24 + lVar32 + lVar25);
        }
        Mat::~Mat(&out);
      }
    }
    pLVar12 = this->activation;
    if (pLVar12 != (Layer *)0x0) {
      (*pLVar12->_vptr_Layer[9])(pLVar12,top_blob,opt);
    }
    local_180 = 0;
  }
  else {
LAB_00149ecd:
    local_180 = 0;
    iVar29 = 0;
    local_184 = 0;
    for (lVar41 = 0; lVar41 < *(int *)(&this->field_0xf0 + (long)p_Var34); lVar41 = lVar41 + 1) {
      Mat::channel_range(&out,&bottom_blob_bordered,iVar29,iVar22 / iVar35);
      Mat::channel_range(&top_blob_g,top_blob,local_184,iVar38 / iVar35);
      pLVar12 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar41];
      opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
      opt_g.use_packing_layout = opt->use_packing_layout;
      opt_g.use_shader_pack8 = opt->use_shader_pack8;
      opt_g.use_bf16_storage = opt->use_bf16_storage;
      opt_g._36_4_ = *(undefined4 *)&opt->field_0x24;
      opt_g.lightmode = opt->lightmode;
      opt_g._1_3_ = *(undefined3 *)&opt->field_0x1;
      opt_g.num_threads = opt->num_threads;
      opt_g.workspace_allocator._0_4_ = *(undefined4 *)&opt->workspace_allocator;
      opt_g.workspace_allocator._4_4_ = *(undefined4 *)((long)&opt->workspace_allocator + 4);
      opt_g.use_winograd_convolution = opt->use_winograd_convolution;
      opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
      opt_g.use_int8_inference = opt->use_int8_inference;
      opt_g.use_vulkan_compute = opt->use_vulkan_compute;
      opt_g.use_fp16_packed = opt->use_fp16_packed;
      opt_g.use_fp16_storage = opt->use_fp16_storage;
      opt_g.use_fp16_arithmetic = opt->use_fp16_arithmetic;
      opt_g.use_int8_storage = opt->use_int8_storage;
      opt_g.blob_allocator = top_blob->allocator;
      (*pLVar12->_vptr_Layer[7])(pLVar12,&out,&top_blob_g,&opt_g);
      Mat::~Mat(&top_blob_g);
      Mat::~Mat(&out);
      p_Var34 = this->_vptr_ConvolutionDepthWise_x86[-3];
      local_184 = local_184 + iVar38 / iVar35;
      iVar29 = iVar29 + iVar22 / iVar35;
    }
  }
LAB_00149fee:
  Mat::~Mat(&bottom_blob_bordered);
  return local_180;
}

Assistant:

int ConvolutionDepthWise_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // float32
    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels == group && group == num_output)
    {
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convdw3x3s1_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }

            return 0;
        }
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convdw3x3s2_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, opt);

            if (activation)
            {
                activation->forward_inplace(top_blob, opt);
            }

            return 0;
        }
    }

    // group convolution
    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    for (int g=0; g<group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered.channel_range(channels_g * g, channels_g);
        Mat top_blob_g = top_blob.channel_range(num_output_g * g, num_output_g);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    return 0;
}